

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eat.c
# Opt level: O3

char * foodword(obj *otmp)

{
  if (otmp->oclass != '\a') {
    if (((otmp->oclass == '\r') && ((*(ushort *)&objects[otmp->otyp].field_0x11 & 0x1f0) == 0x130))
       && ((otmp->field_0x4a & 0x20) != 0)) {
      discover_object((int)otmp->otyp,'\x01','\x01');
    }
    return foodwords_rel +
           *(int *)(foodwords_rel + (*(ushort *)&objects[otmp->otyp].field_0x11 >> 2 & 0x7c));
  }
  return "food";
}

Assistant:

static const char *foodword(struct obj *otmp)
{
	if (otmp->oclass == FOOD_CLASS) return "food";
	if (otmp->oclass == GEM_CLASS &&
	    objects[otmp->otyp].oc_material == GLASS &&
	    otmp->dknown)
		makeknown(otmp->otyp);
	return foodwords[objects[otmp->otyp].oc_material];
}